

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_get_active_buffer_ranges
          (spvc_compiler compiler,spvc_variable_id id,spvc_buffer_range **ranges,size_t *num_ranges)

{
  spvc_context psVar1;
  pointer this;
  size_t sVar2;
  BufferRange *pBVar3;
  pointer pTVar4;
  spvc_buffer_range *psVar5;
  exception *e;
  unique_ptr<TemporaryBuffer<spvc_buffer_range>,_std::default_delete<TemporaryBuffer<spvc_buffer_range>_>_>
  local_238;
  unique_ptr<TemporaryBuffer<spvc_buffer_range>,_std::default_delete<TemporaryBuffer<spvc_buffer_range>_>_>
  ptr;
  spvc_buffer_range trans;
  BufferRange *r;
  BufferRange *__end1;
  BufferRange *__begin1;
  SmallVector<spirv_cross::BufferRange,_8UL> *__range1;
  SmallVector<spvc_buffer_range,_8UL> translated;
  VariableID local_10c;
  undefined1 local_108 [8];
  SmallVector<spirv_cross::BufferRange,_8UL> active_ranges;
  size_t *num_ranges_local;
  spvc_buffer_range **ranges_local;
  spvc_variable_id id_local;
  spvc_compiler compiler_local;
  
  active_ranges.stack_storage.aligned_char._184_8_ = num_ranges;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  spirv_cross::TypedID<(spirv_cross::Types)2>::TypedID(&local_10c,id);
  spirv_cross::Compiler::get_active_buffer_ranges
            ((SmallVector<spirv_cross::BufferRange,_8UL> *)local_108,this,local_10c);
  spirv_cross::SmallVector<spvc_buffer_range,_8UL>::SmallVector
            ((SmallVector<spvc_buffer_range,_8UL> *)&__range1);
  sVar2 = spirv_cross::VectorView<spirv_cross::BufferRange>::size
                    ((VectorView<spirv_cross::BufferRange> *)local_108);
  spirv_cross::SmallVector<spvc_buffer_range,_8UL>::reserve
            ((SmallVector<spvc_buffer_range,_8UL> *)&__range1,sVar2);
  __end1 = spirv_cross::VectorView<spirv_cross::BufferRange>::begin
                     ((VectorView<spirv_cross::BufferRange> *)local_108);
  pBVar3 = spirv_cross::VectorView<spirv_cross::BufferRange>::end
                     ((VectorView<spirv_cross::BufferRange> *)local_108);
  for (; __end1 != pBVar3; __end1 = __end1 + 1) {
    ptr._M_t.
    super___uniq_ptr_impl<TemporaryBuffer<spvc_buffer_range>,_std::default_delete<TemporaryBuffer<spvc_buffer_range>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_TemporaryBuffer<spvc_buffer_range>_*,_std::default_delete<TemporaryBuffer<spvc_buffer_range>_>_>
    .super__Head_base<0UL,_TemporaryBuffer<spvc_buffer_range>_*,_false>._M_head_impl._0_4_ =
         __end1->index;
    spirv_cross::SmallVector<spvc_buffer_range,_8UL>::push_back
              ((SmallVector<spvc_buffer_range,_8UL> *)&__range1,(spvc_buffer_range *)&ptr);
  }
  spvc_allocate<TemporaryBuffer<spvc_buffer_range>>();
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<spvc_buffer_range>,_std::default_delete<TemporaryBuffer<spvc_buffer_range>_>_>
           ::operator->(&local_238);
  spirv_cross::SmallVector<spvc_buffer_range,_8UL>::operator=
            (&pTVar4->buffer,(SmallVector<spvc_buffer_range,_8UL> *)&__range1);
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<spvc_buffer_range>,_std::default_delete<TemporaryBuffer<spvc_buffer_range>_>_>
           ::operator->(&local_238);
  psVar5 = spirv_cross::VectorView<spvc_buffer_range>::data
                     (&(pTVar4->buffer).super_VectorView<spvc_buffer_range>);
  *ranges = psVar5;
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<spvc_buffer_range>,_std::default_delete<TemporaryBuffer<spvc_buffer_range>_>_>
           ::operator->(&local_238);
  sVar2 = spirv_cross::VectorView<spvc_buffer_range>::size
                    (&(pTVar4->buffer).super_VectorView<spvc_buffer_range>);
  *(size_t *)active_ranges.stack_storage.aligned_char._184_8_ = sVar2;
  psVar1 = compiler->context;
  std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
  unique_ptr<TemporaryBuffer<spvc_buffer_range>,std::default_delete<TemporaryBuffer<spvc_buffer_range>>,void>
            ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *)&e,
             &local_238);
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&psVar1->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
  ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::
  unique_ptr<TemporaryBuffer<spvc_buffer_range>,_std::default_delete<TemporaryBuffer<spvc_buffer_range>_>_>
  ::~unique_ptr(&local_238);
  spirv_cross::SmallVector<spvc_buffer_range,_8UL>::~SmallVector
            ((SmallVector<spvc_buffer_range,_8UL> *)&__range1);
  spirv_cross::SmallVector<spirv_cross::BufferRange,_8UL>::~SmallVector
            ((SmallVector<spirv_cross::BufferRange,_8UL> *)local_108);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_active_buffer_ranges(spvc_compiler compiler,
                                                   spvc_variable_id id,
                                                   const spvc_buffer_range **ranges,
                                                   size_t *num_ranges)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto active_ranges = compiler->compiler->get_active_buffer_ranges(id);
		SmallVector<spvc_buffer_range> translated;
		translated.reserve(active_ranges.size());
		for (auto &r : active_ranges)
		{
			spvc_buffer_range trans = { r.index, r.offset, r.range };
			translated.push_back(trans);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_buffer_range>>();
		ptr->buffer = std::move(translated);
		*ranges = ptr->buffer.data();
		*num_ranges = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}